

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_call(jit_State *J,IRCallID id,...)

{
  char in_AL;
  TRef TVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  TRef tr;
  uint32_t n;
  CCallInfo *ci;
  undefined4 *local_148;
  undefined6 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffece;
  undefined2 uVar2;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_58;
  undefined4 local_54;
  undefined4 *local_50;
  undefined1 *local_48;
  TRef local_40;
  uint local_3c;
  CCallInfo *local_38;
  uint local_2c;
  long local_28;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  long local_18;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  long local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_38 = lj_ir_callinfo + in_ESI;
  local_3c = lj_ir_callinfo[in_ESI].flags & 0xff;
  local_40 = 0x7fff;
  local_48 = local_108;
  local_50 = (undefined4 *)&stack0x00000008;
  local_58 = 0x10;
  if ((lj_ir_callinfo[in_ESI].flags & 0x100) != 0) {
    local_3c = local_3c - 1;
  }
  if (local_3c != 0) {
    local_58 = 0x18;
    local_40 = (TRef)local_f8;
  }
  local_54 = 0x30;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_2c = in_ESI;
  local_28 = in_RDI;
  while( true ) {
    uVar2 = (undefined2)local_40;
    if (local_3c < 2) break;
    if (local_58 < 0x29) {
      local_148 = (undefined4 *)(local_48 + (int)local_58);
      local_58 = local_58 + 8;
    }
    else {
      local_148 = local_50;
      local_50 = local_50 + 2;
    }
    local_8 = local_28;
    local_a = 0x6200;
    local_e = (undefined2)*local_148;
    *(undefined2 *)(local_28 + 0xa4) = 0x6200;
    *(undefined2 *)(local_28 + 0xa0) = uVar2;
    *(undefined2 *)(local_28 + 0xa2) = local_e;
    local_3c = local_3c - 1;
    local_c = uVar2;
    local_40 = lj_opt_fold((jit_State *)CONCAT26(uVar2,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffece = uVar2;
  }
  if (local_38->flags >> 0x18 == 0x60) {
    *(undefined1 *)(local_28 + 0x9d) = 1;
  }
  local_1a = *(undefined2 *)((long)&local_38->flags + 2);
  local_18 = local_28;
  local_1e = (undefined2)local_2c;
  *(undefined2 *)(local_28 + 0xa4) = local_1a;
  *(undefined2 *)(local_28 + 0xa0) = uVar2;
  *(undefined2 *)(local_28 + 0xa2) = (undefined2)local_2c;
  local_3c = local_3c - 1;
  local_1c = uVar2;
  TVar1 = lj_opt_fold((jit_State *)CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8));
  return TVar1;
}

Assistant:

TRef lj_ir_call(jit_State *J, IRCallID id, ...)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  uint32_t n = CCI_NARGS(ci);
  TRef tr = TREF_NIL;
  va_list argp;
  va_start(argp, id);
  if ((ci->flags & CCI_L)) n--;
  if (n > 0)
    tr = va_arg(argp, IRRef);
  while (n-- > 1)
    tr = emitir(IRT(IR_CARG, IRT_NIL), tr, va_arg(argp, IRRef));
  va_end(argp);
  if (CCI_OP(ci) == IR_CALLS)
    J->needsnap = 1;  /* Need snapshot after call with side effect. */
  return emitir(CCI_OPTYPE(ci), tr, id);
}